

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Coordinates(AMFImporter *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  CAMFImporter_NodeElement_Coordinates *this_00;
  DeadlyImportError *this_01;
  float fVar4;
  byte local_2d1;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  bool close_found;
  CAMFImporter_NodeElement_Coordinates *pCStack_30;
  bool read_flag [3];
  CAMFImporter_NodeElement_Coordinates *als;
  CAMFImporter_NodeElement_Coordinates *local_18;
  CAMFImporter_NodeElement *ne;
  AMFImporter *this_local;
  
  ne = (CAMFImporter_NodeElement *)this;
  this_00 = (CAMFImporter_NodeElement_Coordinates *)operator_new(0x60);
  CAMFImporter_NodeElement_Coordinates::CAMFImporter_NodeElement_Coordinates
            (this_00,this->mNodeElement_Cur);
  pCStack_30 = this_00;
  local_18 = this_00;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    memset(&local_33,0,3);
    ParseHelper_Node_Enter(this,&local_18->super_CAMFImporter_NodeElement);
    local_34 = 0;
    do {
      do {
        while( true ) {
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar2 & 1) == 0) goto LAB_005e6295;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"x",&local_59);
          bVar1 = XML_CheckNode_NameEqual(this,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::allocator<char>::~allocator(&local_59);
          if (bVar1) {
            if ((local_33 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"x",&local_81);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a8,"Only one component can be defined.",&local_a9);
              Throw_MoreThanOnceDefined(this,&local_80,&local_a8);
              std::__cxx11::string::~string((string *)&local_a8);
              std::allocator<char>::~allocator(&local_a9);
              std::__cxx11::string::~string((string *)&local_80);
              std::allocator<char>::~allocator(&local_81);
            }
            fVar4 = XML_ReadNode_GetVal_AsFloat(this);
            (pCStack_30->Coordinate).x = fVar4;
            local_33 = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"y",&local_d1);
            bVar1 = XML_CheckNode_NameEqual(this,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::allocator<char>::~allocator(&local_d1);
            if (bVar1) {
              if ((local_32 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f8,"y",&local_f9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_120,"Only one component can be defined.",&local_121);
                Throw_MoreThanOnceDefined(this,&local_f8,&local_120);
                std::__cxx11::string::~string((string *)&local_120);
                std::allocator<char>::~allocator(&local_121);
                std::__cxx11::string::~string((string *)&local_f8);
                std::allocator<char>::~allocator(&local_f9);
              }
              fVar4 = XML_ReadNode_GetVal_AsFloat(this);
              (pCStack_30->Coordinate).y = fVar4;
              local_32 = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"z",&local_149);
              bVar1 = XML_CheckNode_NameEqual(this,&local_148);
              std::__cxx11::string::~string((string *)&local_148);
              std::allocator<char>::~allocator(&local_149);
              if (bVar1) {
                if ((local_31 & 1) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_170,"z",&local_171);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_198,"Only one component can be defined.",&local_199);
                  Throw_MoreThanOnceDefined(this,&local_170,&local_198);
                  std::__cxx11::string::~string((string *)&local_198);
                  std::allocator<char>::~allocator(&local_199);
                  std::__cxx11::string::~string((string *)&local_170);
                  std::allocator<char>::~allocator(&local_171);
                }
                fVar4 = XML_ReadNode_GetVal_AsFloat(this);
                (pCStack_30->Coordinate).z = fVar4;
                local_31 = 1;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c0,"coordinates",&local_1c1);
                XML_CheckNode_SkipUnsupported(this,&local_1c0);
                std::__cxx11::string::~string((string *)&local_1c0);
                std::allocator<char>::~allocator(&local_1c1);
              }
            }
          }
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar3 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"coordinates",&local_1e9);
      bVar1 = XML_CheckNode_NameEqual(this,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
    } while (!bVar1);
    local_34 = 1;
LAB_005e6295:
    if ((local_34 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"coordinates",&local_211);
      Throw_CloseNotFound(this,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
    }
    ParseHelper_Node_Exit(this);
    local_2d1 = 0;
    if (((local_33 & 1) != 0) && (local_2d1 = 0, (local_32 & 1) != 0)) {
      local_2d1 = local_31;
    }
    if ((local_2d1 & 1) == 0) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Not all coordinate\'s components are defined.",&local_239);
      DeadlyImportError::DeadlyImportError(this_01,&local_238);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,(value_type *)&local_18);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,(value_type *)&local_18);
  return;
}

Assistant:

void AMFImporter::ParseNode_Coordinates()
{
CAMFImporter_NodeElement* ne;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Coordinates(mNodeElement_Cur);

	CAMFImporter_NodeElement_Coordinates& als = *((CAMFImporter_NodeElement_Coordinates*)ne);// alias for convenience

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool read_flag[3] = { false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("coordinates");
			MACRO_NODECHECK_READCOMP_F("x", read_flag[0], als.Coordinate.x);
			MACRO_NODECHECK_READCOMP_F("y", read_flag[1], als.Coordinate.y);
			MACRO_NODECHECK_READCOMP_F("z", read_flag[2], als.Coordinate.z);
		MACRO_NODECHECK_LOOPEND("coordinates");
		ParseHelper_Node_Exit();
		// check that all components was defined
		if((read_flag[0] && read_flag[1] && read_flag[2]) == 0) throw DeadlyImportError("Not all coordinate's components are defined.");

	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}